

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O3

bool __thiscall
skiwi::environment<skiwi::alpha_conversion_data>::find
          (environment<skiwi::alpha_conversion_data> *this,alpha_conversion_data *e,string *name)

{
  element_type *peVar1;
  iterator iVar2;
  bool bVar3;
  shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> p_outer_copy;
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->env)._M_t._M_impl.super__Rb_tree_header) {
    local_30 = (this->p_outer).
               super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_28._M_pi =
         (this->p_outer).
         super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      }
    }
    if (local_30 != (element_type *)0x0) {
      do {
        iVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>_>
                        *)local_30,name);
        if ((_Rb_tree_header *)iVar2._M_node != &(local_30->env)._M_t._M_impl.super__Rb_tree_header)
        {
          std::__cxx11::string::_M_assign((string *)e);
          e->forward_declaration = SUB41(iVar2._M_node[3]._M_color,0);
          bVar3 = true;
          goto LAB_0017df12;
        }
        peVar1 = (local_30->p_outer).
                 super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_28,
                   &(local_30->p_outer).
                    super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        local_30 = peVar1;
      } while (peVar1 != (element_type *)0x0);
    }
    bVar3 = false;
LAB_0017df12:
    if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)e);
    e->forward_declaration = SUB41(iVar2._M_node[3]._M_color,0);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool find(TEntry& e, const std::string& name)
      {
      auto it = env.find(name);
      if (it != env.end())
        {
        e = it->second;
        return true;
        }
      auto p_outer_copy = p_outer;
      while (p_outer_copy)
        {
        it = p_outer_copy->env.find(name);
        if (it != p_outer_copy->env.end())
          {
          e = it->second;
          return true;
          }
        p_outer_copy = p_outer_copy->p_outer;
        }
      return false;
      }